

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O1

void copy_action(void)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  int lineno;
  bool bVar4;
  bool bVar5;
  long lVar6;
  FILE *__stream;
  bucket **ppbVar7;
  bool bVar8;
  int i;
  char *line;
  long lVar9;
  ulong uVar10;
  char *line_00;
  union_tag *puVar11;
  ushort **ppuVar12;
  bucket *pbVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  char *pcVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  char *local_88;
  
  __stream = action_file;
  lineno = input_file->lineno;
  line = dup_line();
  lVar21 = (long)cptr - (long)::line;
  if (last_was_action == '\x01') {
    insert_empty_rule();
  }
  last_was_action = 1;
  trialaction = *cptr == '[';
  fprintf((FILE *)__stream,"case %d:\n",(ulong)(nrules - 2));
  if (trialaction == '\0') {
    fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
  }
  if (lflag == '\0') {
    fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
  }
  if (*cptr == '=') {
    cptr = cptr + 1;
  }
  pbVar13 = pitem[(long)nitems + -1];
  if (pbVar13 == (bucket *)0x0) {
    iVar14 = 0;
    iVar18 = 0;
    iVar23 = nitems;
  }
  else {
    lVar15 = 0;
    iVar18 = 0;
    do {
      iVar18 = iVar18 + (uint)(pbVar13->class != '\x04');
      pbVar13 = pitem[(long)nitems + lVar15 + -2];
      lVar15 = lVar15 + -1;
    } while (pbVar13 != (bucket *)0x0);
    iVar14 = -(int)lVar15;
    iVar23 = nitems + (int)lVar15;
  }
  if (iVar18 != 0) {
    local_88 = allocate(iVar18 * 4 + 4);
    if (local_88 != (char *)0x0) goto LAB_00115f5d;
    no_space();
  }
  local_88 = (char *)0x0;
LAB_00115f5d:
  ppbVar7 = pitem;
  uVar10 = (ulong)(uint)nitems;
  if (iVar23 < nitems) {
    lVar15 = (long)iVar23;
    iVar19 = 0;
    do {
      iVar23 = iVar23 + 1;
      if (ppbVar7[lVar15]->class != '\x04') {
        lVar9 = (long)iVar19;
        iVar19 = iVar19 + 1;
        *(int *)(local_88 + lVar9 * 4 + 4) = iVar23 - (int)uVar10;
      }
      lVar15 = lVar15 + 1;
      uVar10 = (ulong)nitems;
    } while (lVar15 < (long)uVar10);
  }
  ppbVar7 = pitem;
  lVar15 = (long)nitems;
LAB_00115fc6:
  iVar23 = 0;
  bVar8 = false;
LAB_00115fd0:
  bVar5 = bVar8;
  pcVar20 = cptr;
  cVar2 = *cptr;
  uVar10 = (ulong)(uint)(int)cVar2;
  bVar8 = bVar5;
  if ((int)cVar2 == 0x24) {
    cVar2 = cptr[1];
    if (cVar2 == '$') {
      if (havetags == 0) {
        fprintf((FILE *)__stream,"%sval",symbol_prefix);
      }
      else {
        if (plhs[nrules]->tag == (union_tag *)0x0) {
          pcVar20 = (char *)0x0;
        }
        else {
          pcVar20 = plhs[nrules]->tag->name;
        }
        if (pcVar20 == (char *)0x0) {
          untyped_lhs();
        }
        fprintf((FILE *)__stream,"%sval.%s",symbol_prefix,pcVar20);
      }
      cptr = cptr + 2;
      bVar8 = true;
      goto LAB_00115fd0;
    }
    if (cVar2 == '<') {
      iVar19 = input_file->lineno;
      line_00 = dup_line();
      lVar9 = (long)cptr - (long)::line;
      cptr = cptr + 1;
      puVar11 = get_tag(1);
      pcVar1 = cptr;
      pcVar20 = puVar11->name;
      cVar2 = *cptr;
      uVar16 = (uint)cVar2;
      uVar10 = (ulong)uVar16;
      if (uVar16 == 0x24) {
        fprintf((FILE *)__stream,"%sval.%s",symbol_prefix);
        cptr = cptr + 1;
LAB_00116077:
        free(line_00);
      }
      else {
        ppuVar12 = __ctype_b_loc();
        uVar3 = (*ppuVar12)[(int)uVar16];
        if ((uVar3 >> 0xb & 1) == 0) {
          if ((cVar2 == '-') && ((*(byte *)((long)*ppuVar12 + (long)pcVar1[1] * 2 + 1) & 8) != 0)) {
            cptr = pcVar1 + 1;
            iVar19 = get_number();
            fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,(ulong)(uint)-(iVar14 + iVar19),
                    pcVar20);
            goto LAB_00116077;
          }
          if ((cVar2 != '_') && ((uVar3 & 0x400) == 0)) {
            dollar_error(iVar19,line_00,line_00 + lVar9);
            goto LAB_001162e7;
          }
          puVar11 = get_tag(0);
          uVar16 = plhs[nrules]->args;
          uVar17 = uVar16 + 1;
          uVar10 = (ulong)uVar16;
          do {
            uVar24 = (int)uVar16 >> 0x1f & uVar16;
            if ((int)uVar10 < 1) break;
            uVar17 = uVar17 - 1;
            lVar6 = uVar10 - 1;
            uVar10 = uVar10 - 1;
            uVar24 = uVar17;
          } while (puVar11->name != plhs[nrules]->argnames[lVar6]);
          if ((int)uVar24 < 1) {
            error(iVar19,line_00,line_00 + lVar9,"unknown argument %s");
          }
          fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,
                  (ulong)(uVar24 - (plhs[nrules]->args + iVar14)),pcVar20);
        }
        else {
          i = get_number();
          uVar16 = i - iVar18;
          if (uVar16 == 0 || i < iVar18) {
            uVar16 = *(uint *)(local_88 + (long)i * 4);
          }
          else {
            dollar_warning(iVar19,i);
          }
          fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,(ulong)uVar16,pcVar20);
        }
        free(line_00);
      }
      goto LAB_00115fd0;
    }
    pcVar1 = cptr + 1;
    ppuVar12 = __ctype_b_loc();
    if (((*ppuVar12)[cVar2] >> 0xb & 1) == 0) {
      if (cVar2 == '-') {
        cptr = pcVar20 + 2;
        iVar19 = get_number();
        if (havetags != 0) {
          unknown_rhs(-iVar19);
        }
        uVar16 = -(iVar19 + iVar14);
LAB_00116427:
        pcVar20 = "%svsp[%d]";
LAB_00116431:
        uVar10 = (ulong)uVar16;
        goto LAB_001165ef;
      }
      if ((cVar2 != '_') && (uVar10 = 0x24, ((*ppuVar12)[cVar2] & 0x400) == 0)) goto LAB_001162e7;
      cptr = pcVar1;
      puVar11 = get_tag(0);
      pcVar20 = puVar11->name;
      uVar16 = plhs[nrules]->args;
      uVar24 = (int)uVar16 >> 0x1f & uVar16;
      uVar17 = uVar16;
      do {
        uVar16 = uVar16 - 1;
        uVar25 = uVar24;
        uVar22 = uVar24 - 1;
        if ((int)uVar17 < 1) break;
        uVar22 = uVar17 - 1;
        uVar25 = uVar17;
        uVar17 = uVar22;
      } while (pcVar20 != plhs[nrules]->argnames[uVar16]);
      if ((int)uVar25 < 1) {
        error(input_file->lineno,::line,cptr,"unknown argument %s",pcVar20);
      }
      pcVar1 = plhs[nrules]->argtags[(int)uVar22];
      fprintf((FILE *)__stream,"%svsp[%d]",symbol_prefix,
              (ulong)(uVar25 - (plhs[nrules]->args + iVar14)));
      if (pcVar1 == (char *)0x0) {
        if (havetags != 0) {
          error(input_file->lineno,(char *)0x0,(char *)0x0,"untyped argument $%s",pcVar20);
        }
      }
      else {
        fprintf((FILE *)__stream,".%s",pcVar1);
      }
      goto LAB_00115fd0;
    }
    cptr = pcVar1;
    iVar19 = get_number();
    if (havetags != 0) {
      if ((iVar19 < 1) || (iVar18 < iVar19)) {
        unknown_rhs(iVar19);
      }
      puVar11 = ppbVar7[lVar15 + (long)*(int *)(local_88 + (long)iVar19 * 4) + -1]->tag;
      if (puVar11 == (union_tag *)0x0) {
        pcVar20 = (char *)0x0;
      }
      else {
        pcVar20 = puVar11->name;
      }
      if (pcVar20 == (char *)0x0) {
        untyped_rhs(iVar19,ppbVar7[lVar15 + (long)*(int *)(local_88 + (long)iVar19 * 4) + -1]->name)
        ;
      }
      fprintf((FILE *)__stream,"%svsp[%d].%s",symbol_prefix,
              (ulong)*(uint *)(local_88 + (long)iVar19 * 4),pcVar20);
      goto LAB_00115fd0;
    }
    if (iVar14 < iVar19) {
      dollar_warning(input_file->lineno,iVar19);
      uVar16 = iVar19 - iVar18;
      goto LAB_00116427;
    }
    uVar10 = (ulong)*(uint *)(local_88 + (long)iVar19 * 4);
    pcVar20 = "%svsp[%d]";
  }
  else {
    if (cVar2 != '@') {
LAB_001162e7:
      ppuVar12 = __ctype_b_loc();
      iVar19 = (int)uVar10;
      if (((((*ppuVar12)[iVar19] >> 10 & 1) != 0) || (iVar19 == 0x5f)) || (iVar19 == 0x24)) {
        do {
          do {
            putc((int)uVar10,(FILE *)__stream);
            pcVar20 = cptr + 1;
            cVar2 = cptr[1];
            uVar10 = (ulong)cVar2;
            cptr = pcVar20;
          } while (((*ppuVar12)[uVar10] & 8) != 0);
        } while ((cVar2 == '$') || (cVar2 == '_'));
        goto LAB_00115fd0;
      }
      cptr = cptr + 1;
      if ((iVar19 == 0x5b && iVar23 == 0) && trialaction != '\0') {
        putc(0x7b,(FILE *)__stream);
        iVar23 = 1;
        goto LAB_00115fd0;
      }
      if ((iVar23 != 1 || iVar19 != 0x5d) || trialaction == '\0') {
        putc(iVar19,(FILE *)__stream);
        if (iVar19 < 0x3b) {
          if (iVar19 < 0x27) {
            if (iVar19 == 10) {
              get_line();
              if (::line == (char *)0x0) {
                unterminated_action(lineno,line,line + lVar21);
                goto LAB_001168ff;
              }
              goto LAB_00115fd0;
            }
            if (iVar19 != 0x22) goto LAB_00115fd0;
          }
          else if (iVar19 != 0x27) {
            if (iVar19 == 0x2f) {
              copy_comment(__stream,(FILE *)0x0);
            }
            goto LAB_00115fd0;
          }
          copy_string(iVar19,__stream,(FILE *)0x0);
          goto LAB_00115fd0;
        }
        if (iVar19 < 0x5d) {
          if (iVar19 == 0x3b) {
LAB_001168ff:
            if (iVar23 < 1) {
              fputc(10,(FILE *)__stream);
              goto joined_r0x00116a49;
            }
          }
          else if (iVar19 == 0x5b) {
            iVar23 = iVar23 + 1;
          }
          goto LAB_00115fd0;
        }
        if (iVar19 == 0x5d) {
          iVar23 = iVar23 + -1;
        }
        else if (iVar19 == 0x7b) {
          iVar23 = iVar23 + 1;
        }
        else if ((iVar19 == 0x7d) &&
                (iVar19 = iVar23 + -1, bVar4 = iVar23 < 2, iVar23 = iVar19, bVar4)) {
          iVar19 = nextc();
          if (iVar19 == 0x5b && !bVar5) {
            trialaction = '\x01';
          }
          else {
            fputc(10,(FILE *)__stream);
            if ((iVar19 != 0x7b) || (bVar5)) goto joined_r0x00116a49;
            if (lflag == '\0') {
              fwrite("#\n",2,1,(FILE *)__stream);
            }
            fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
            bVar8 = false;
            if (lflag != '\0') goto LAB_00115fd0;
            fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
          }
          bVar8 = false;
        }
        goto LAB_00115fd0;
      }
      putc(0x7d,(FILE *)__stream);
      iVar19 = nextc();
      iVar23 = 0;
      bVar8 = false;
      if (iVar19 == 0x5b && !bVar5) goto LAB_00115fd0;
      fputc(10,(FILE *)__stream);
      if ((iVar19 != 0x7b) || (bVar5)) {
joined_r0x00116a49:
        if (lflag == '\0') {
          fwrite("#\n",2,1,(FILE *)__stream);
        }
        fwrite("break;\n",7,1,(FILE *)__stream);
        free(line);
        if (iVar18 == 0) {
          return;
        }
        free(local_88);
        return;
      }
      if (lflag == '\0') {
        fwrite("#\n",2,1,(FILE *)__stream);
      }
      fprintf((FILE *)__stream,"  if (!%strial)\n",symbol_prefix);
      if (lflag == '\0') {
        fprintf((FILE *)__stream,line_format,(ulong)(uint)input_file->lineno,input_file->name);
      }
      trialaction = '\0';
      goto LAB_00115fc6;
    }
    cVar2 = cptr[1];
    if ((cVar2 == '@') || (cVar2 == '$')) {
      fprintf((FILE *)__stream,"%spos",symbol_prefix);
      cptr = cptr + 2;
      goto LAB_00115fd0;
    }
    ppuVar12 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar12 + (long)cVar2 * 2 + 1) & 8) == 0) {
      uVar10 = 0x40;
      if (cVar2 != '-') goto LAB_001162e7;
      cptr = pcVar20 + 2;
      iVar19 = get_number();
      uVar16 = -(iVar14 + iVar19);
    }
    else {
      cptr = pcVar20 + 1;
      iVar19 = get_number();
      if (iVar14 < iVar19) {
        at_warning(input_file->lineno,iVar19);
        uVar16 = iVar19 - iVar18;
        pcVar20 = "%spsp[%d]";
        goto LAB_00116431;
      }
      uVar16 = *(uint *)(local_88 + (long)iVar19 * 4);
    }
    uVar10 = (ulong)uVar16;
    pcVar20 = "%spsp[%d]";
  }
LAB_001165ef:
  fprintf((FILE *)__stream,pcVar20,symbol_prefix,uVar10);
  goto LAB_00115fd0;
}

Assistant:

void copy_action()
{
    register int c;
    register int i, j, n;
    int depth;
    int haveyyval = 0;
    char *tag;
    register FILE *f = action_file;
    int a_lineno = input_file->lineno;
    char *a_line = dup_line();
    char *a_cptr = a_line + (cptr - line);
    Yshort *offsets=0, maxoffset;
    bucket **rhs;

    if (last_was_action)
	insert_empty_rule();
    last_was_action = 1;
    trialaction = (*cptr == '[');

    fprintf(f, "case %d:\n", nrules - 2);
    if (!trialaction)
	fprintf(f, "  if (!%strial)\n", symbol_prefix);
    if (!lflag)
	fprintf(f, line_format, input_file->lineno, input_file->name);
    if (*cptr == '=') ++cptr;

    /* FIXME -- the argument offset table is computed independently in
     * FIXME -- several places (compile_arg, copy_action, and can_elide_arg)
     * FIXME -- those multiple implementations should be factored into
     * FIXME -- a single function. */
    maxoffset = n = 0;
    for (i = nitems - 1; pitem[i]; --i) {
	n++;
	if (pitem[i]->class != ARGUMENT)
	    maxoffset++; }
    if (maxoffset > 0) {
	offsets = NEW2(maxoffset+1, Yshort);
	if (offsets == 0) no_space(); }
    for (j=0, i++; i<nitems; i++)
	if (pitem[i]->class != ARGUMENT)
	    offsets[++j] = i - nitems + 1;
    rhs = pitem + nitems - 1;

    depth = 0;
loop:
    c = *cptr;
    if (c == '$') {
	if (cptr[1] == '<') {
	    int d_lineno = input_file->lineno;
	    char *d_line = dup_line();
	    char *d_cptr = d_line + (cptr - line);

	    ++cptr;
	    tag = get_tag(1)->name;
	    c = *cptr;
	    if (c == '$') {
		fprintf(f, "%sval.%s", symbol_prefix, tag);
		++cptr;
		FREE(d_line);
		goto loop; }
	    else if (isdigit(c)) {
		i = get_number();
		if (i > maxoffset) {
		    dollar_warning(d_lineno, i);
		    fprintf(f, "%svsp[%d].%s", symbol_prefix, i - maxoffset, tag); }
		else
		    fprintf(f, "%svsp[%d].%s", symbol_prefix, offsets[i], tag);
		FREE(d_line);
		goto loop; }
	    else if (c == '-' && isdigit(cptr[1])) {
		++cptr;
		i = -get_number() - n;
		fprintf(f, "%svsp[%d].%s", symbol_prefix, i, tag);
		FREE(d_line);
		goto loop; }
	    else if (isalpha(c) || c == '_') {
		char *arg = get_tag(0)->name;
		for (i=plhs[nrules]->args-1; i>=0; i--)
		    if (arg == plhs[nrules]->argnames[i]) break;
		if (i<0)
		    error(d_lineno,d_line,d_cptr,"unknown argument %s",arg);
		fprintf(f, "%svsp[%d].%s", symbol_prefix, i-plhs[nrules]->args+1-n, tag);
		FREE(d_line);
		goto loop; }
	    else
		dollar_error(d_lineno, d_line, d_cptr); }
	else if (cptr[1] == '$') {
	    if (havetags) {
		tag = plhs[nrules]->tag ? plhs[nrules]->tag->name : 0;
		if (tag == 0) untyped_lhs();
		fprintf(f, "%sval.%s", symbol_prefix, tag); }
	    else
		fprintf(f, "%sval", symbol_prefix);
	    cptr += 2;
	    haveyyval = 1;
	    goto loop; }
	else if (isdigit(cptr[1])) {
	    ++cptr;
	    i = get_number();
	    if (havetags) {
		if (i <= 0 || i > maxoffset)
		    unknown_rhs(i);
		tag = rhs[offsets[i]]->tag ? rhs[offsets[i]]->tag->name : 0;
		if (tag == 0)
		    untyped_rhs(i, rhs[offsets[i]]->name);
		fprintf(f, "%svsp[%d].%s", symbol_prefix, offsets[i], tag); }
	    else {
		if (i > n) {
		    dollar_warning(input_file->lineno, i);
		    fprintf(f, "%svsp[%d]", symbol_prefix, i - maxoffset); }
		else
		    fprintf(f, "%svsp[%d]", symbol_prefix, offsets[i]); }
	    goto loop; }
	else if (cptr[1] == '-') {
	    cptr += 2;
	    i = get_number();
	    if (havetags)
		unknown_rhs(-i);
	    fprintf(f, "%svsp[%d]", symbol_prefix, -i - n);
	    goto loop; }
	else if (isalpha(cptr[1]) || cptr[1] == '_') {
	    char *arg;
	    ++cptr;
	    arg = get_tag(0)->name;
	    for (i=plhs[nrules]->args-1; i>=0; i--)
		if (arg == plhs[nrules]->argnames[i]) break;
	    if (i<0)
		error(input_file->lineno, line, cptr, "unknown argument %s", arg);
	    tag = plhs[nrules]->argtags[i];
	    fprintf(f, "%svsp[%d]", symbol_prefix, i - plhs[nrules]->args + 1 - n);
	    if (tag) fprintf(f, ".%s", tag);
	    else if (havetags)
		error(input_file->lineno, 0, 0, "untyped argument $%s", arg);
	    goto loop; }
    } else if (c == '@') {
	if (cptr[1] == '@' || cptr[1] == '$') {
	    fprintf(f, "%spos", symbol_prefix);
	    cptr += 2;
	    goto loop; }
	else if (isdigit(cptr[1])) {
	    ++cptr;
	    i = get_number();
	    if (i > n) {
		at_warning(input_file->lineno, i);
		fprintf(f, "%spsp[%d]", symbol_prefix, i - maxoffset); }
	    else
		fprintf(f, "%spsp[%d]", symbol_prefix, offsets[i]);
	    goto loop; }
	else if (cptr[1] == '-') {
	    cptr += 2;
	    i = get_number();
	    fprintf(f, "%spsp[%d]", symbol_prefix, -i - n);
	    goto loop; } }
    if (isalpha(c) || c == '_' || c == '$') {
	do {
	    putc(c, f);
	    c = *++cptr;
	} while (isalnum(c) || c == '_' || c == '$');
	goto loop; }
    ++cptr;
    if (trialaction && c == '[' && depth == 0) {
	++depth;
	putc('{', f);
	goto loop; }
    if (trialaction && c == ']' && depth == 1) {
	--depth;
	putc('}', f);
	c = nextc();
	if (c == '[' && !haveyyval) {
	    goto loop; }
	else if (c == '{' && !haveyyval) {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "  if (!%strial)\n", symbol_prefix);
	    if (!lflag)
		fprintf(f, line_format, input_file->lineno, input_file->name);
	    trialaction = 0;
	    goto loop; }
	else {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "break;\n");
	    FREE(a_line);
	    if (maxoffset > 0) FREE(offsets);
	    return; } }
    putc(c, f);
    switch (c) {
    case '\n':
	get_line();
	if (line) goto loop;
	unterminated_action(a_lineno, a_line, a_cptr);
    case ';':
	if (depth > 0) goto loop;
	fprintf(f, "\n");
	if (!lflag) fprintf(f, "#\n");
	fprintf(f, "break;\n");
	FREE(a_line);
	if (maxoffset > 0) FREE(offsets);
	return;
    case '[':
	++depth;
	goto loop;
    case ']':
	--depth;
	goto loop;
    case '{':
	++depth;
	goto loop;
    case '}':
	if (--depth > 0) goto loop;
	c = nextc();
	if (c == '[' && !haveyyval) {
	    trialaction = 1;
	    goto loop; }
	else if (c == '{' && !haveyyval) {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "  if (!%strial)\n", symbol_prefix);
	    if (!lflag)
		fprintf(f, line_format, input_file->lineno, input_file->name);
	    goto loop; }
	else {
	    fprintf(f, "\n");
	    if (!lflag) fprintf(f, "#\n");
	    fprintf(f, "break;\n");
	    FREE(a_line);
	    if (maxoffset > 0) FREE(offsets);
	    return; }
    case '\'':
    case '"':
	copy_string(c, f, 0);
	goto loop;
    case '/':
	copy_comment(f, 0);
	goto loop;
    default:
	goto loop; }
}